

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O1

Chromosome * __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::findFittestChromosome
          (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *this)

{
  Chromosome *pCVar1;
  bool bVar2;
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  _Var3;
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  __it1;
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  __it2;
  undefined1 local_29;
  
  _Var3._M_current =
       (this->_chromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->_chromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __it1._M_current = _Var3._M_current + 1;
  if (__it1._M_current != pCVar1 && _Var3._M_current != pCVar1) {
    __it2._M_current = _Var3._M_current;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_comp_iter<crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::findFittestChromosome()const::{lambda(crsGA::Chromosome<Gen,ComputeFitness>const&,crsGA::Chromosome<Gen,ComputeFitness>const&)#1}>
              ::operator()(&local_29,__it1,__it2);
      _Var3._M_current = __it1._M_current;
      if (!bVar2) {
        _Var3._M_current = __it2._M_current;
      }
      __it1._M_current = __it1._M_current + 1;
      __it2._M_current = _Var3._M_current;
    } while (__it1._M_current != pCVar1);
  }
  this->_fittestChromosomeIndex =
       ((long)_Var3._M_current -
        (long)(this->_chromosomes).
              super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  return _Var3._M_current;
}

Assistant:

const Chromosome &findFittestChromosome() const
    {
        auto result = std::min_element(_chromosomes.begin(), _chromosomes.end(),
                                       [](const Chromosome &c1, const Chromosome &c2) {
                                           LOG_DEBUG("C1 Fitness:", c1.getFitness(), " C2 Fitness:", c2.getFitness());
                                           return (c1.getFitness() < c2.getFitness());
                                       });
        _fittestChromosomeIndex = std::distance(_chromosomes.begin(), result);
        return *result;
    }